

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O1

DynamicProfileInfo *
Js::DynamicProfileInfo::Deserialize<Js::BufferReader>
          (BufferReader *reader,Recycler *recycler,LocalFunctionId *functionId)

{
  Type *pTVar1;
  Type *addr;
  Type *addr_00;
  Type *addr_01;
  Type *addr_02;
  Type *addr_03;
  Type *pTVar2;
  Type *addr_04;
  code *pcVar3;
  unsigned_short uVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  BVIndex BVar8;
  Recycler *pRVar9;
  undefined4 *puVar10;
  ValueType *data_00;
  LdElemInfo *data_01;
  DynamicProfileFunctionInfo *pDVar11;
  Type *addr_05;
  ulong uVar12;
  StElemInfo *pSVar13;
  StElemInfo *pSVar14;
  undefined1 local_f8 [8];
  TrackAllocData data;
  FldInfo *local_c8;
  ValueType *local_c0;
  CallSiteInfo *local_b8;
  CallSiteInfo *local_b0;
  ValueType *local_a8;
  ValueType *local_a0;
  ValueType *local_98;
  ImplicitCallFlags *local_90;
  Bits local_85;
  BVFixed *pBStack_80;
  Bits bits;
  uint local_74;
  AutoNestedHandledExceptionType local_70;
  uint32 recursiveInlineInfo;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  ThisInfo thisInfo;
  uint local_5c;
  uint local_58;
  uint fldInfoCount;
  uint loopCount;
  ImplicitCallFlags implicitCallFlags;
  unsigned_short local_46;
  unsigned_short local_44;
  unsigned_short local_42;
  unsigned_short local_40;
  ArgSlot paramInfoCount;
  ProfileId ldLenInfoCount;
  ProfileId ldElemInfoCount;
  ProfileId stElemInfoCount;
  ProfileId arrayCallSiteCount;
  ProfileId slotInfoCount;
  ProfileId callSiteInfoCount;
  ProfileId callApplyTargetInfoCount;
  ProfileId returnTypeInfoCount;
  ProfileId divCount;
  ProfileId switchCount;
  
  local_46 = 0;
  local_44 = 0;
  local_42 = 0;
  local_40 = 0;
  paramInfoCount = 0;
  ldLenInfoCount = 0;
  ldElemInfoCount = 0;
  stElemInfoCount = 0;
  arrayCallSiteCount = 0;
  slotInfoCount = 0;
  callSiteInfoCount = 0;
  local_5c = 0;
  local_58 = 0;
  _loopCount = recycler;
  ValueType::ValueType((ValueType *)&recursiveInlineInfo);
  recursiveInlineInfo._2_1_ = ThisType_Unknown;
  local_74 = 0;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (&local_70,ExceptionType_OutOfMemory);
  bVar5 = BufferReader::Read<unsigned_int>(reader,functionId);
  if (bVar5) {
    bVar5 = BufferReader::Read<unsigned_short>(reader,&local_46);
    if (!bVar5) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                  ,0x8cc,"(false)","false");
      goto LAB_009787e2;
    }
    if ((ulong)local_46 == 0) {
      data_00 = (ValueType *)0x0;
LAB_00978826:
      bVar6 = BufferReader::Read<unsigned_short>(reader,&local_44);
      bVar5 = true;
      if (bVar6) {
        if ((ulong)local_44 == 0) {
          pSVar14 = (StElemInfo *)0x0;
        }
        else {
          local_f8 = (undefined1  [8])&LdLenInfo::typeinfo;
          data.typeinfo = (type_info *)0x0;
          data.count = (size_t)anon_var_dwarf_499f363;
          data.filename._0_4_ = 0x8e0;
          data.plusSize = (ulong)local_44;
          pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8);
          uVar4 = local_44;
          uVar12 = (ulong)local_44;
          if (uVar12 == 0) {
            ___autoNestedHandledExceptionType = (StElemInfo *)&DAT_00000008;
            Memory::Recycler::ClearTrackAllocInfo(pRVar9,(TrackAllocData *)0x0);
          }
          else {
            BVar7 = ExceptionCheck::CanHandleOutOfMemory();
            if (BVar7 == 0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              ___autoNestedHandledExceptionType = (StElemInfo *)__tls_get_addr(&PTR_0155fe48);
              ___autoNestedHandledExceptionType->arrayType =
                   (anon_union_2_4_ea848c7b_for_ValueType_13)0x1;
              ___autoNestedHandledExceptionType->flags = FldInfo_NoInfo;
              ___autoNestedHandledExceptionType->field_2 =
                   (anon_union_1_2_471f577c_for_StElemInfo_2)0x0;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                          ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                          "ExceptionCheck::CanHandleOutOfMemory()");
              if (!bVar6) goto LAB_00979112;
              ___autoNestedHandledExceptionType->arrayType =
                   (anon_union_2_4_ea848c7b_for_ValueType_13)0x0;
              ___autoNestedHandledExceptionType->flags = FldInfo_NoInfo;
              ___autoNestedHandledExceptionType->field_2 =
                   (anon_union_1_2_471f577c_for_StElemInfo_2)0x0;
            }
            ___autoNestedHandledExceptionType =
                 (StElemInfo *)
                 Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                           (pRVar9,(ulong)((uint)uVar4 * 4));
            if (___autoNestedHandledExceptionType == (StElemInfo *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar10 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                          ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
              if (!bVar6) goto LAB_00979112;
              *puVar10 = 0;
            }
            pSVar13 = ___autoNestedHandledExceptionType + uVar12;
            pSVar14 = ___autoNestedHandledExceptionType;
            do {
              ValueType::ValueType(&pSVar14->arrayType);
              pSVar14->flags = FldInfo_NoInfo;
              pSVar14 = pSVar14 + 1;
            } while (pSVar14 != pSVar13);
          }
          pSVar14 = ___autoNestedHandledExceptionType;
          bVar6 = BufferReader::ReadArray<Js::LdLenInfo>
                            (reader,(LdLenInfo *)___autoNestedHandledExceptionType,(ulong)local_44);
          if (!bVar6) goto LAB_0097909d;
        }
        bVar6 = BufferReader::Read<unsigned_short>(reader,&local_42);
        if (bVar6) {
          if ((ulong)local_42 == 0) {
            data_01 = (LdElemInfo *)0x0;
          }
          else {
            local_f8 = (undefined1  [8])&LdElemInfo::typeinfo;
            data.typeinfo = (type_info *)0x0;
            data.count = (size_t)anon_var_dwarf_499f363;
            data.filename._0_4_ = 0x8ee;
            data.plusSize = (ulong)local_42;
            pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8);
            data_01 = Memory::AllocateArray<Memory::Recycler,Js::LdElemInfo,false>
                                ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                 (ulong)local_42);
            bVar6 = BufferReader::ReadArray<Js::LdElemInfo>(reader,data_01,(ulong)local_42);
            if (!bVar6) goto LAB_0097909d;
          }
          bVar6 = BufferReader::Read<unsigned_short>(reader,&local_40);
          if (bVar6) {
            if ((ulong)local_40 == 0) {
              ___autoNestedHandledExceptionType = (StElemInfo *)0x0;
            }
            else {
              local_f8 = (undefined1  [8])&StElemInfo::typeinfo;
              data.typeinfo = (type_info *)0x0;
              data.count = (size_t)anon_var_dwarf_499f363;
              data.filename._0_4_ = 0x8fc;
              data.plusSize = (ulong)local_40;
              pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8);
              ___autoNestedHandledExceptionType =
                   Memory::AllocateArray<Memory::Recycler,Js::StElemInfo,false>
                             ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf,0,
                              (ulong)local_40);
              bVar6 = BufferReader::ReadArray<Js::StElemInfo>
                                (reader,___autoNestedHandledExceptionType,(ulong)local_40);
              if (!bVar6) goto LAB_0097909d;
            }
            bVar6 = BufferReader::Read<unsigned_short>(reader,&paramInfoCount);
            if (bVar6) {
              if ((ulong)paramInfoCount == 0) {
                data.line = 0;
                data._36_4_ = 0;
              }
              else {
                local_f8 = (undefined1  [8])&ArrayCallSiteInfo::typeinfo;
                data.typeinfo = (type_info *)0x0;
                data.count = (size_t)anon_var_dwarf_499f363;
                data.filename._0_4_ = 0x90a;
                data.plusSize = (ulong)paramInfoCount;
                pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8);
                data._32_8_ = Memory::AllocateArray<Memory::Recycler,Js::ArrayCallSiteInfo,false>
                                        ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                         (ulong)paramInfoCount);
                bVar6 = BufferReader::ReadArray<Js::ArrayCallSiteInfo>
                                  (reader,(ArrayCallSiteInfo *)data._32_8_,(ulong)paramInfoCount);
                if (!bVar6) goto LAB_0097909d;
              }
              bVar6 = BufferReader::Read<unsigned_int>(reader,&local_5c);
              if (bVar6) {
                if ((ulong)local_5c == 0) {
                  local_c8 = (FldInfo *)0x0;
                }
                else {
                  local_f8 = (undefined1  [8])&FldInfo::typeinfo;
                  data.typeinfo = (type_info *)0x0;
                  data.count = (size_t)anon_var_dwarf_499f363;
                  data.filename._0_4_ = 0x918;
                  data.plusSize = (ulong)local_5c;
                  pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8);
                  local_c8 = Memory::AllocateArray<Memory::Recycler,Js::FldInfo,false>
                                       ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf,0,
                                        (ulong)local_5c);
                  bVar6 = BufferReader::ReadArray<Js::FldInfo>(reader,local_c8,(ulong)local_5c);
                  if (!bVar6) goto LAB_0097909d;
                }
                bVar6 = BufferReader::Read<unsigned_short>(reader,&ldLenInfoCount);
                if (bVar6) {
                  if ((ulong)ldLenInfoCount == 0) {
                    local_c0 = (ValueType *)0x0;
                  }
                  else {
                    local_f8 = (undefined1  [8])&ValueType::typeinfo;
                    data.typeinfo = (type_info *)0x0;
                    data.count = (size_t)anon_var_dwarf_499f363;
                    data.filename._0_4_ = 0x926;
                    data.plusSize = (ulong)ldLenInfoCount;
                    pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8)
                    ;
                    local_c0 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                         ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf,0
                                          ,(ulong)ldLenInfoCount);
                    bVar6 = BufferReader::ReadArray<ValueType>
                                      (reader,local_c0,(ulong)ldLenInfoCount);
                    if (!bVar6) goto LAB_0097909d;
                  }
                  bVar6 = BufferReader::Read<unsigned_short>(reader,&ldElemInfoCount);
                  if (bVar6) {
                    if ((ulong)ldElemInfoCount == 0) {
                      local_b8 = (CallSiteInfo *)0x0;
                    }
                    else {
                      local_f8 = (undefined1  [8])&CallSiteInfo::typeinfo;
                      data.typeinfo = (type_info *)0x0;
                      data.count = (size_t)anon_var_dwarf_499f363;
                      data.filename._0_4_ = 0x937;
                      data.plusSize = (ulong)ldElemInfoCount;
                      pRVar9 = Memory::Recycler::TrackAllocInfo
                                         (_loopCount,(TrackAllocData *)local_f8);
                      local_b8 = Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                           ((Memory *)pRVar9,(Recycler *)Memory::Recycler::AllocLeaf
                                            ,0,(ulong)ldElemInfoCount);
                      bVar6 = BufferReader::ReadArray<Js::CallSiteInfo>
                                        (reader,local_b8,(ulong)ldElemInfoCount);
                      if (!bVar6) goto LAB_0097909d;
                    }
                    bVar6 = BufferReader::Read<unsigned_short>(reader,&stElemInfoCount);
                    if (bVar6) {
                      if ((ulong)stElemInfoCount == 0) {
                        local_b0 = (CallSiteInfo *)0x0;
                      }
                      else {
                        local_f8 = (undefined1  [8])&CallSiteInfo::typeinfo;
                        data.typeinfo = (type_info *)0x0;
                        data.count = (size_t)anon_var_dwarf_499f363;
                        data.filename._0_4_ = 0x948;
                        data.plusSize = (ulong)stElemInfoCount;
                        pRVar9 = Memory::Recycler::TrackAllocInfo
                                           (_loopCount,(TrackAllocData *)local_f8);
                        local_b0 = Memory::AllocateArray<Memory::Recycler,Js::CallSiteInfo,false>
                                             ((Memory *)pRVar9,
                                              (Recycler *)Memory::Recycler::AllocLeaf,0,
                                              (ulong)stElemInfoCount);
                        bVar6 = BufferReader::ReadArray<Js::CallSiteInfo>
                                          (reader,local_b0,(ulong)stElemInfoCount);
                        if (!bVar6) goto LAB_0097909d;
                      }
                      bVar6 = BufferReader::Read<unsigned_short>(reader,&slotInfoCount);
                      if (bVar6) {
                        if ((ulong)slotInfoCount == 0) {
                          local_a8 = (ValueType *)0x0;
                        }
                        else {
                          local_f8 = (undefined1  [8])&ValueType::typeinfo;
                          data.typeinfo = (type_info *)0x0;
                          data.count = (size_t)anon_var_dwarf_499f363;
                          data.filename._0_4_ = 0x956;
                          data.plusSize = (ulong)slotInfoCount;
                          pRVar9 = Memory::Recycler::TrackAllocInfo
                                             (_loopCount,(TrackAllocData *)local_f8);
                          local_a8 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                               ((Memory *)pRVar9,
                                                (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                (ulong)slotInfoCount);
                          bVar6 = BufferReader::ReadArray<ValueType>
                                            (reader,local_a8,(ulong)slotInfoCount);
                          if (!bVar6) goto LAB_0097909d;
                        }
                        bVar6 = BufferReader::Read<unsigned_short>(reader,&callSiteInfoCount);
                        if (bVar6) {
                          if ((ulong)callSiteInfoCount == 0) {
                            local_a0 = (ValueType *)0x0;
                          }
                          else {
                            local_f8 = (undefined1  [8])&ValueType::typeinfo;
                            data.typeinfo = (type_info *)0x0;
                            data.count = (size_t)anon_var_dwarf_499f363;
                            data.filename._0_4_ = 0x964;
                            data.plusSize = (ulong)callSiteInfoCount;
                            pRVar9 = Memory::Recycler::TrackAllocInfo
                                               (_loopCount,(TrackAllocData *)local_f8);
                            local_a0 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                 ((Memory *)pRVar9,
                                                  (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                  (ulong)callSiteInfoCount);
                            bVar6 = BufferReader::ReadArray<ValueType>
                                              (reader,local_a0,(ulong)callSiteInfoCount);
                            if (!bVar6) goto LAB_0097909d;
                          }
                          bVar6 = BufferReader::Read<unsigned_short>(reader,&arrayCallSiteCount);
                          if (bVar6) {
                            if ((ulong)arrayCallSiteCount == 0) {
                              local_98 = (ValueType *)0x0;
                            }
                            else {
                              local_f8 = (undefined1  [8])&ValueType::typeinfo;
                              data.typeinfo = (type_info *)0x0;
                              data.count = (size_t)anon_var_dwarf_499f363;
                              data.filename._0_4_ = 0x972;
                              data.plusSize = (ulong)arrayCallSiteCount;
                              pRVar9 = Memory::Recycler::TrackAllocInfo
                                                 (_loopCount,(TrackAllocData *)local_f8);
                              local_98 = Memory::AllocateArray<Memory::Recycler,ValueType,false>
                                                   ((Memory *)pRVar9,
                                                    (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                    (ulong)arrayCallSiteCount);
                              bVar6 = BufferReader::ReadArray<ValueType>
                                                (reader,local_98,(ulong)arrayCallSiteCount);
                              if (!bVar6) goto LAB_0097909d;
                            }
                            bVar6 = BufferReader::Read<unsigned_int>(reader,&local_58);
                            if (bVar6) {
                              if ((ulong)local_58 == 0) {
                                local_90 = (ImplicitCallFlags *)0x0;
                              }
                              else {
                                local_f8 = (undefined1  [8])&ImplicitCallFlags::typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.count = (size_t)anon_var_dwarf_499f363;
                                data.filename._0_4_ = 0x980;
                                data.plusSize = (ulong)local_58;
                                pRVar9 = Memory::Recycler::TrackAllocInfo
                                                   (_loopCount,(TrackAllocData *)local_f8);
                                local_90 = Memory::
                                           AllocateArray<Memory::Recycler,Js::ImplicitCallFlags,false>
                                                     ((Memory *)pRVar9,
                                                      (Recycler *)Memory::Recycler::AllocLeaf,0,
                                                      (ulong)local_58);
                                bVar6 = BufferReader::ReadArray<Js::ImplicitCallFlags>
                                                  (reader,local_90,(ulong)local_58);
                                if (!bVar6) goto LAB_0097909d;
                              }
                              bVar6 = BufferReader::Read<Js::ImplicitCallFlags>
                                                (reader,(ImplicitCallFlags *)
                                                        ((long)&fldInfoCount + 3));
                              if ((((bVar6) &&
                                   (bVar6 = BufferReader::Read<Js::ThisInfo>
                                                      (reader,(ThisInfo *)&recursiveInlineInfo),
                                   bVar6)) &&
                                  (bVar6 = BufferReader::Read<Js::DynamicProfileInfo::Bits>
                                                     (reader,&local_85), bVar6)) &&
                                 (bVar6 = BufferReader::Read<unsigned_int>(reader,&local_74), bVar6)
                                 ) {
                                if (local_58 == 0) {
                                  pBStack_80 = (BVFixed *)0x0;
                                }
                                else {
                                  pBStack_80 = BVFixed::New<Memory::Recycler>
                                                         (local_58 * 2,_loopCount,false);
                                  BVar8 = BVFixed::WordCount(pBStack_80);
                                  bVar6 = BufferReader::ReadArray<BVUnitT<unsigned_long>>
                                                    (reader,(BVUnitT<unsigned_long> *)
                                                            (pBStack_80 + 1),(ulong)BVar8);
                                  if (!bVar6) goto LAB_0097909d;
                                }
                                local_f8 = (undefined1  [8])&DynamicProfileFunctionInfo::typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.plusSize = 0xffffffffffffffff;
                                data.count = (size_t)anon_var_dwarf_499f363;
                                data.filename._0_4_ = 0x998;
                                pRVar9 = Memory::Recycler::TrackAllocInfo
                                                   (_loopCount,(TrackAllocData *)local_f8);
                                pDVar11 = (DynamicProfileFunctionInfo *)
                                          new<Memory::Recycler>(0x20,pRVar9,0x781bfc);
                                pDVar11->paramInfoCount = local_46;
                                pDVar11->ldLenInfoCount = local_44;
                                pDVar11->ldElemInfoCount = local_42;
                                pDVar11->stElemInfoCount = local_40;
                                pDVar11->arrayCallSiteCount = paramInfoCount;
                                pDVar11->fldInfoCount = local_5c;
                                pDVar11->slotInfoCount = ldLenInfoCount;
                                pDVar11->callSiteInfoCount = ldElemInfoCount;
                                pDVar11->callApplyTargetInfoCount = stElemInfoCount;
                                pDVar11->divCount = slotInfoCount;
                                pDVar11->switchCount = callSiteInfoCount;
                                pDVar11->returnTypeInfoCount = arrayCallSiteCount;
                                pDVar11->loopCount = local_58;
                                local_f8 = (undefined1  [8])&typeinfo;
                                data.typeinfo = (type_info *)0x0;
                                data.plusSize = 0xffffffffffffffff;
                                data.count = (size_t)anon_var_dwarf_499f363;
                                data.filename._0_4_ = 0x9a7;
                                pRVar9 = Memory::Recycler::TrackAllocInfo
                                                   (_loopCount,(TrackAllocData *)local_f8);
                                reader = (BufferReader *)new<Memory::Recycler>(0xa8,pRVar9,0x38bbb2)
                                ;
                                DynamicProfileInfo((DynamicProfileInfo *)reader);
                                Memory::Recycler::WBSetBit((char *)reader);
                                (((DynamicProfileInfo *)reader)->dynamicProfileFunctionInfo).ptr =
                                     pDVar11;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(reader);
                                pTVar1 = &((DynamicProfileInfo *)reader)->parameterInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar1);
                                pTVar1->ptr = data_00;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                addr = &((DynamicProfileInfo *)reader)->ldLenInfo;
                                Memory::Recycler::WBSetBit((char *)addr);
                                addr->ptr = (LdLenInfo *)pSVar14;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
                                addr_00 = &((DynamicProfileInfo *)reader)->ldElemInfo;
                                Memory::Recycler::WBSetBit((char *)addr_00);
                                addr_00->ptr = data_01;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
                                addr_01 = &((DynamicProfileInfo *)reader)->stElemInfo;
                                Memory::Recycler::WBSetBit((char *)addr_01);
                                addr_01->ptr = ___autoNestedHandledExceptionType;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_01);
                                addr_02 = &((DynamicProfileInfo *)reader)->arrayCallSiteInfo;
                                Memory::Recycler::WBSetBit((char *)addr_02);
                                addr_02->ptr = (ArrayCallSiteInfo *)data._32_8_;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_02);
                                addr_03 = &((DynamicProfileInfo *)reader)->fldInfo;
                                Memory::Recycler::WBSetBit((char *)addr_03);
                                addr_03->ptr = local_c8;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_03);
                                pTVar1 = &((DynamicProfileInfo *)reader)->slotInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar1);
                                pTVar1->ptr = local_c0;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                pTVar2 = &((DynamicProfileInfo *)reader)->callSiteInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar2);
                                pTVar2->ptr = local_b8;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
                                pTVar2 = &((DynamicProfileInfo *)reader)->callApplyTargetInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar2);
                                pTVar2->ptr = local_b0;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar2);
                                pTVar1 = &((DynamicProfileInfo *)reader)->divideTypeInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar1);
                                pTVar1->ptr = local_a8;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                pTVar1 = &((DynamicProfileInfo *)reader)->switchTypeInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar1);
                                pTVar1->ptr = local_a0;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                pTVar1 = &((DynamicProfileInfo *)reader)->returnTypeInfo;
                                Memory::Recycler::WBSetBit((char *)pTVar1);
                                pTVar1->ptr = local_98;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(pTVar1);
                                addr_04 = &((DynamicProfileInfo *)reader)->loopImplicitCallFlags;
                                Memory::Recycler::WBSetBit((char *)addr_04);
                                addr_04->ptr = local_90;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_04);
                                ((DynamicProfileInfo *)reader)->implicitCallFlags =
                                     fldInfoCount._3_1_;
                                addr_05 = &((DynamicProfileInfo *)reader)->loopFlags;
                                Memory::Recycler::WBSetBit((char *)addr_05);
                                addr_05->ptr = pBStack_80;
                                Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_05);
                                (((DynamicProfileInfo *)reader)->thisInfo).thisType =
                                     recursiveInlineInfo._2_1_;
                                (((DynamicProfileInfo *)reader)->thisInfo).valueType.field_0 =
                                     recursiveInlineInfo._0_2_;
                                *(undefined4 *)&((DynamicProfileInfo *)reader)->bits =
                                     local_85._0_4_;
                                (((DynamicProfileInfo *)reader)->bits).field_0x4 = local_85._4_1_;
                                ((DynamicProfileInfo *)reader)->m_recursiveInlineInfo = local_74;
                                ResetAllPolymorphicCallSiteInfo((DynamicProfileInfo *)reader);
                                bVar5 = false;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      local_f8 = (undefined1  [8])&ValueType::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_499f363;
      data.filename._0_4_ = 0x8d2;
      data.plusSize = (ulong)local_46;
      pRVar9 = Memory::Recycler::TrackAllocInfo(_loopCount,(TrackAllocData *)local_f8);
      uVar4 = local_46;
      if (local_46 == 0) {
        data_00 = (ValueType *)&DAT_00000008;
        Memory::Recycler::ClearTrackAllocInfo(pRVar9,(TrackAllocData *)0x0);
      }
      else {
        BVar7 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                      "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar5) goto LAB_00979112;
          *puVar10 = 0;
        }
        data_00 = (ValueType *)
                  Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                            (pRVar9,(ulong)((uint)uVar4 + (uint)uVar4));
        if (data_00 == (ValueType *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar10 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                      ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar5) goto LAB_00979112;
          *puVar10 = 0;
        }
        uVar12 = 0;
        do {
          ValueType::ValueType((ValueType *)((long)&data_00->field_0 + uVar12));
          uVar12 = uVar12 + 2;
        } while ((uint)uVar4 * 2 != uVar12);
      }
      bVar5 = BufferReader::ReadArray<ValueType>(reader,data_00,(ulong)local_46);
      if (bVar5) goto LAB_00978826;
      bVar5 = true;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x8c6,"(false)","false");
LAB_009787e2:
    if (bVar5 == false) goto LAB_00979112;
    *puVar10 = 0;
    bVar5 = false;
    reader = (BufferReader *)0x0;
  }
LAB_0097909d:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_70);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x9c6,"(false)","false");
    if (!bVar5) {
LAB_00979112:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
    reader = (BufferReader *)0x0;
  }
  return (DynamicProfileInfo *)reader;
}

Assistant:

DynamicProfileInfo * DynamicProfileInfo::Deserialize(T * reader, Recycler* recycler, Js::LocalFunctionId * functionId)
    {
        Js::ArgSlot paramInfoCount = 0;
        ProfileId ldLenInfoCount = 0;
        ProfileId ldElemInfoCount = 0;
        ProfileId stElemInfoCount = 0;
        ProfileId arrayCallSiteCount = 0;
        ProfileId slotInfoCount = 0;
        ProfileId callSiteInfoCount = 0;
        ProfileId callApplyTargetInfoCount = 0;
        ProfileId returnTypeInfoCount = 0;
        ProfileId divCount = 0;
        ProfileId switchCount = 0;
        uint fldInfoCount = 0;
        uint loopCount = 0;
        ValueType * paramInfo = nullptr;
        LdLenInfo * ldLenInfo = nullptr;
        LdElemInfo * ldElemInfo = nullptr;
        StElemInfo * stElemInfo = nullptr;
        ArrayCallSiteInfo * arrayCallSiteInfo = nullptr;
        FldInfo * fldInfo = nullptr;
        ValueType * slotInfo = nullptr;
        CallSiteInfo * callSiteInfo = nullptr;
        CallSiteInfo * callApplyTargetInfo = nullptr;
        ValueType * divTypeInfo = nullptr;
        ValueType * switchTypeInfo = nullptr;
        ValueType * returnTypeInfo = nullptr;
        ImplicitCallFlags * loopImplicitCallFlags = nullptr;
        BVFixed * loopFlags = nullptr;
        ImplicitCallFlags implicitCallFlags;
        ThisInfo thisInfo;
        Bits bits;
        uint32 recursiveInlineInfo = 0;

        try
        {
            AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_OutOfMemory);

            if (!reader->Read(functionId))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (!reader->Read(&paramInfoCount))
            {
                AssertOrFailFast(false);
                return nullptr;
            }

            if (paramInfoCount != 0)
            {
                paramInfo = RecyclerNewArrayLeaf(recycler, ValueType, paramInfoCount);
                if (!reader->ReadArray(paramInfo, paramInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldLenInfoCount))
            {
                goto Error;
            }

            if (ldLenInfoCount != 0)
            {
                ldLenInfo = RecyclerNewArrayLeaf(recycler, LdLenInfo, ldLenInfoCount);
                if (!reader->ReadArray(ldLenInfo, ldLenInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&ldElemInfoCount))
            {
                goto Error;
            }

            if (ldElemInfoCount != 0)
            {
                ldElemInfo = RecyclerNewArrayLeaf(recycler, LdElemInfo, ldElemInfoCount);
                if (!reader->ReadArray(ldElemInfo, ldElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&stElemInfoCount))
            {
                goto Error;
            }

            if (stElemInfoCount != 0)
            {
                stElemInfo = RecyclerNewArrayLeaf(recycler, StElemInfo, stElemInfoCount);
                if (!reader->ReadArray(stElemInfo, stElemInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&arrayCallSiteCount))
            {
                goto Error;
            }

            if (arrayCallSiteCount != 0)
            {
                arrayCallSiteInfo = RecyclerNewArrayLeaf(recycler, ArrayCallSiteInfo, arrayCallSiteCount);
                if (!reader->ReadArray(arrayCallSiteInfo, arrayCallSiteCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&fldInfoCount))
            {
                goto Error;
            }

            if (fldInfoCount != 0)
            {
                fldInfo = RecyclerNewArrayLeaf(recycler, FldInfo, fldInfoCount);
                if (!reader->ReadArray(fldInfo, fldInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&slotInfoCount))
            {
                goto Error;
            }

            if (slotInfoCount != 0)
            {
                slotInfo = RecyclerNewArrayLeaf(recycler, ValueType, slotInfoCount);
                if (!reader->ReadArray(slotInfo, slotInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callSiteInfoCount))
            {
                goto Error;
            }

            if (callSiteInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callSiteInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callSiteInfoCount);
                if (!reader->ReadArray(callSiteInfo, callSiteInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&callApplyTargetInfoCount))
            {
                goto Error;
            }

            if (callApplyTargetInfoCount != 0)
            {
                // CallSiteInfo contains pointer "polymorphicCallSiteInfo", but
                // we explicitly save that pointer in FunctionBody. Safe to
                // allocate CallSiteInfo[] as Leaf here.
                callApplyTargetInfo = RecyclerNewArrayLeaf(recycler, CallSiteInfo, callApplyTargetInfoCount);
                if (!reader->ReadArray(callApplyTargetInfo, callApplyTargetInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&divCount))
            {
                goto Error;
            }

            if (divCount != 0)
            {
                divTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, divCount);
                if (!reader->ReadArray(divTypeInfo, divCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&switchCount))
            {
                goto Error;
            }

            if (switchCount != 0)
            {
                switchTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, switchCount);
                if (!reader->ReadArray(switchTypeInfo, switchCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&returnTypeInfoCount))
            {
                goto Error;
            }

            if (returnTypeInfoCount != 0)
            {
                returnTypeInfo = RecyclerNewArrayLeaf(recycler, ValueType, returnTypeInfoCount);
                if (!reader->ReadArray(returnTypeInfo, returnTypeInfoCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&loopCount))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopImplicitCallFlags = RecyclerNewArrayLeaf(recycler, ImplicitCallFlags, loopCount);
                if (!reader->ReadArray(loopImplicitCallFlags, loopCount))
                {
                    goto Error;
                }
            }

            if (!reader->Read(&implicitCallFlags) ||
                !reader->Read(&thisInfo) ||
                !reader->Read(&bits) ||
                !reader->Read(&recursiveInlineInfo))
            {
                goto Error;
            }

            if (loopCount != 0)
            {
                loopFlags = BVFixed::New(loopCount * LoopFlags::COUNT, recycler);
                if (!reader->ReadArray(loopFlags->GetData(), loopFlags->WordCount()))
                {
                    goto Error;
                }
            }

            DynamicProfileFunctionInfo * dynamicProfileFunctionInfo = RecyclerNewStructLeaf(recycler, DynamicProfileFunctionInfo);
            dynamicProfileFunctionInfo->paramInfoCount = paramInfoCount;
            dynamicProfileFunctionInfo->ldLenInfoCount = ldLenInfoCount;
            dynamicProfileFunctionInfo->ldElemInfoCount = ldElemInfoCount;
            dynamicProfileFunctionInfo->stElemInfoCount = stElemInfoCount;
            dynamicProfileFunctionInfo->arrayCallSiteCount = arrayCallSiteCount;
            dynamicProfileFunctionInfo->fldInfoCount = fldInfoCount;
            dynamicProfileFunctionInfo->slotInfoCount = slotInfoCount;
            dynamicProfileFunctionInfo->callSiteInfoCount = callSiteInfoCount;
            dynamicProfileFunctionInfo->callApplyTargetInfoCount = callApplyTargetInfoCount;
            dynamicProfileFunctionInfo->divCount = divCount;
            dynamicProfileFunctionInfo->switchCount = switchCount;
            dynamicProfileFunctionInfo->returnTypeInfoCount = returnTypeInfoCount;
            dynamicProfileFunctionInfo->loopCount = loopCount;

            DynamicProfileInfo * dynamicProfileInfo = RecyclerNew(recycler, DynamicProfileInfo);
            dynamicProfileInfo->dynamicProfileFunctionInfo = dynamicProfileFunctionInfo;
            dynamicProfileInfo->parameterInfo = paramInfo;
            dynamicProfileInfo->ldLenInfo = ldLenInfo;
            dynamicProfileInfo->ldElemInfo = ldElemInfo;
            dynamicProfileInfo->stElemInfo = stElemInfo;
            dynamicProfileInfo->arrayCallSiteInfo = arrayCallSiteInfo;
            dynamicProfileInfo->fldInfo = fldInfo;
            dynamicProfileInfo->slotInfo = slotInfo;
            dynamicProfileInfo->callSiteInfo = callSiteInfo;
            dynamicProfileInfo->callApplyTargetInfo = callApplyTargetInfo;
            dynamicProfileInfo->divideTypeInfo = divTypeInfo;
            dynamicProfileInfo->switchTypeInfo = switchTypeInfo;
            dynamicProfileInfo->returnTypeInfo = returnTypeInfo;
            dynamicProfileInfo->loopImplicitCallFlags = loopImplicitCallFlags;
            dynamicProfileInfo->implicitCallFlags = implicitCallFlags;
            dynamicProfileInfo->loopFlags = loopFlags;
            dynamicProfileInfo->thisInfo = thisInfo;
            dynamicProfileInfo->bits = bits;
            dynamicProfileInfo->m_recursiveInlineInfo = recursiveInlineInfo;

            // Fixed functions and object type data is not serialized. There is no point in trying to serialize polymorphic call site info.
            dynamicProfileInfo->ResetAllPolymorphicCallSiteInfo();

            return dynamicProfileInfo;
        }
        catch (OutOfMemoryException)
        {
        }

    Error:
        AssertOrFailFast(false);
        return nullptr;
    }